

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_create(nvrm_ioctl_create *s,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  uint32_t status;
  code *UNRECOVERED_JUMPTABLE;
  FILE *__stream;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  mmt_buf *buf;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("cid");
    if (iVar3 != 0) goto LAB_0025509b;
  }
  else {
LAB_0025509b:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("handle");
    if (iVar3 != 0) goto LAB_002550e4;
  }
  else {
LAB_002550e4:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
    pcVar4 = nvrm_pfx;
  }
  fprintf(_stdout,"%sclass: 0x%04x",pcVar4,(ulong)s->cls);
  pcVar4 = nvrm_get_class_name(s->cls);
  if (pcVar4 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar4);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->parent;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("parent");
    if (iVar3 != 0) goto LAB_00255190;
  }
  else {
LAB_00255190:
    fprintf(_stdout,"%sparent: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  if (s->ptr == 0) {
    iVar3 = _nvrm_field_enabled("ptr");
    if (iVar3 == 0) goto LAB_0025524a;
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr: %s",nvrm_pfx);
  }
  else {
    fprintf(_stdout,"%sptr: 0x%016lx",nvrm_pfx);
    if (0 < argc) {
      buf = find_ptr(s->ptr,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0025524d;
    }
    fputs(" [no data]",_stdout);
LAB_0025524a:
    buf = (mmt_buf *)0x0;
  }
LAB_0025524d:
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  status = s->status;
  if (status == 0) {
    iVar3 = _nvrm_field_enabled("status");
    if (iVar3 == 0) goto LAB_0025529f;
  }
  __stream = _stdout;
  nvrm_status(status);
  fprintf(__stream,"%sstatus: %s",pcVar4);
  pcVar4 = nvrm_sep;
LAB_0025529f:
  nvrm_pfx = pcVar4;
  if (s->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",pcVar4,colors->err,(ulong)s->_pad,colors->reset);
    nvrm_pfx = nvrm_sep;
  }
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    uVar5 = (ulong)(uint)nvrm_create_arg_decoder_cnt;
    if (nvrm_create_arg_decoder_cnt < 1) {
      uVar5 = 0;
    }
    uVar2 = 0;
    do {
      uVar6 = uVar2;
      if (uVar5 * 0x10 + 0x10 == uVar6 + 0x10) goto LAB_00255384;
      uVar2 = uVar6 + 0x10;
    } while (*(uint32_t *)((long)&nvrm_create_arg_decoders[0].cls + uVar6) != s->cls);
    if (*(uint32_t *)((long)&nvrm_create_arg_decoders[0].size + uVar6) != buf->len) {
LAB_00255384:
      dump_mmt_buf_as_words_horiz(buf,"ptr[]:");
      return;
    }
    nvrm_pfx = "";
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG:         %s","ptr[]: ");
    }
    else {
      fprintf(_stdout,"%64s        %s"," ","ptr[]: ");
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)&nvrm_create_arg_decoders[0].fun + uVar6);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(s,buf + 1);
      return;
    }
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create(struct nvrm_ioctl_create *s, struct mmt_memory_dump *args, int argc)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	struct mmt_buf *data = nvrm_print_ptr(s, ptr, args, argc);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad);
	nvrm_print_ln();

	if (data)
	{
		int found = 0;

		void (*fun)(struct nvrm_ioctl_create *, void *) = NULL;

		struct nvrm_create_arg_decoder *dec;
		int k;
		for (k = 0; k < nvrm_create_arg_decoder_cnt; ++k)
		{
			dec = &nvrm_create_arg_decoders[k];
			if (dec->cls == s->cls)
			{
				if (dec->size == data->len)
				{
					nvrm_reset_pfx();
					mmt_log("        %s", "ptr[]: ");
					fun = dec->fun;
					if (fun)
						fun(s, (void *)data->data);

					found = 1;
				}
				break;
			}
		}

		if (!found)
			dump_mmt_buf_as_words_horiz(data, "ptr[]:");
	}
}